

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O2

bool __thiscall
iDynTree::KinDynComputations::getCentroidalAverageVelocity
          (KinDynComputations *this,Span<double,__1L> vel)

{
  pointer local_a0;
  undefined8 local_98;
  Matrix<double,_6,_1,_0,_6,_1> local_88;
  KinDynComputations local_50 [3];
  
  if (vel.storage_.super_extent_type<_1L>.size_.size_ == 6) {
    getCentroidalAverageVelocity(local_50);
    toEigen(&local_88,(SpatialMotionVector *)local_50);
    local_98 = 6;
    local_a0 = vel.storage_.data_;
    Eigen::internal::
    call_assignment<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::Matrix<double,6,1,0,6,1>>
              ((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_a0,
               &local_88);
  }
  else {
    iDynTree::reportError
              ("KinDynComputations","getCentroidalAverageVelocity","Wrong size in input vel");
  }
  return vel.storage_.super_extent_type<_1L>.size_.size_ == 6;
}

Assistant:

bool KinDynComputations::getCentroidalAverageVelocity(Span<double> vel)
{
    constexpr int expected_spatial_velocity_size = 6;
    bool ok = vel.size() == expected_spatial_velocity_size;
    if( !ok )
    {
        reportError("KinDynComputations","getCentroidalAverageVelocity","Wrong size in input vel");
        return false;
    }

    toEigen(vel) = toEigen(getCentroidalAverageVelocity());

    return true;
}